

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O2

void output_conll(vector<unsigned_int,_std::allocator<unsigned_int>_> *sentence,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *pos,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *sentenceUnkStrings,
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *intToWords,
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *intToPos,
                 map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *hyp,
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *rel_hyp)

{
  uint uVar1;
  pointer puVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this;
  uint uVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  ostream *poVar8;
  uint uVar9;
  pointer pbVar10;
  char cVar11;
  int iVar12;
  ulong uVar13;
  allocator local_d9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d8;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_d0;
  _Base_ptr local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hyp_rel;
  string wit;
  allocator local_50 [32];
  
  local_c8 = &(intToWords->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_b0 = &(hyp->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_b8 = &(rel_hyp->_M_t)._M_impl.super__Rb_tree_header._M_header;
  uVar9 = 0;
  local_d8 = sentence;
  local_d0 = &intToWords->_M_t;
  local_c0 = sentenceUnkStrings;
  local_a8 = &hyp->_M_t;
  local_a0 = pos;
  local_98 = &intToPos->_M_t;
  do {
    pvVar3 = local_c0;
    uVar13 = (ulong)uVar9;
    puVar2 = (local_d8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (((long)(local_d8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)puVar2 >> 2) - 1U <= uVar13) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      return;
    }
    if ((ulong)((long)(local_c0->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_c0->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar13) goto LAB_00215e43;
    uVar1 = puVar2[uVar13];
    std::__cxx11::string::string((string *)&wit,"UNK",local_50);
    uVar4 = cpyp::Corpus::get_or_add_word(&corpus,&wit);
    if ((uVar1 != uVar4) ||
       ((pvVar3->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_string_length == 0)) {
      uVar1 = (local_d8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar13];
      std::__cxx11::string::string((string *)&hyp_rel,"UNK",&local_d9);
      uVar4 = cpyp::Corpus::get_or_add_word(&corpus,&hyp_rel);
      if ((uVar1 == uVar4) ||
         ((pvVar3->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_string_length != 0)) {
LAB_00215e43:
        __assert_fail("i < sentenceUnkStrings.size() && ((sentence[i] == corpus.get_or_add_word(cpyp::Corpus::UNK) && sentenceUnkStrings[i].size() > 0) || (sentence[i] != corpus.get_or_add_word(cpyp::Corpus::UNK) && sentenceUnkStrings[i].size() == 0 && intToWords.find(sentence[i]) != intToWords.end()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                      ,0x36a,
                      "void output_conll(const vector<unsigned int> &, const vector<unsigned int> &, const vector<string> &, const map<unsigned int, string> &, const map<unsigned int, string> &, const map<int, int> &, const map<int, string> &)"
                     );
      }
      cVar5 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(local_d0,(local_d8->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + uVar13);
      if (cVar5._M_node == local_c8) goto LAB_00215e43;
      std::__cxx11::string::~string((string *)&hyp_rel);
    }
    std::__cxx11::string::~string((string *)&wit);
    pbVar10 = (pvVar3->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar10[uVar13]._M_string_length == 0) {
      cVar5 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(local_d0,(local_d8->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + uVar13);
      pbVar10 = (pointer)&cVar5._M_node[1]._M_parent;
    }
    else {
      pbVar10 = pbVar10 + uVar13;
    }
    std::__cxx11::string::string((string *)&wit,(string *)pbVar10);
    cVar5 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(local_98,(local_a0->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start + uVar13);
    this = local_a8;
    hyp_rel._M_dataplus._M_p._0_4_ = uVar9;
    cVar6 = std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::find(local_a8,(key_type *)&hyp_rel);
    if (cVar6._M_node == local_b0) {
      __assert_fail("hyp.find(i) != hyp.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                    ,0x36e,
                    "void output_conll(const vector<unsigned int> &, const vector<unsigned int> &, const vector<string> &, const map<unsigned int, string> &, const map<unsigned int, string> &, const map<int, int> &, const map<int, string> &)"
                   );
    }
    hyp_rel._M_dataplus._M_p._0_4_ = uVar9;
    cVar6 = std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::find(this,(key_type *)&hyp_rel);
    iVar12 = *(int *)&cVar6._M_node[1].field_0x4 + 1;
    if (iVar12 == (int)((ulong)((long)(local_d8->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_d8->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 2)) {
      iVar12 = 0;
    }
    hyp_rel._M_dataplus._M_p._0_4_ = uVar9;
    cVar7 = std::
            _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&rel_hyp->_M_t,(key_type *)&hyp_rel);
    if (cVar7._M_node == local_b8) {
      __assert_fail("hyp_rel_it != rel_hyp.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                    ,0x372,
                    "void output_conll(const vector<unsigned int> &, const vector<unsigned int> &, const vector<string> &, const map<unsigned int, string> &, const map<unsigned int, string> &, const map<int, int> &, const map<int, string> &)"
                   );
    }
    std::__cxx11::string::string((string *)&hyp_rel,(string *)&cVar7._M_node[1]._M_parent);
    cVar11 = (char)&hyp_rel;
    std::__cxx11::string::find(cVar11,0x28);
    std::__cxx11::string::rfind(cVar11,0x29);
    std::__cxx11::string::substr((ulong)local_50,(ulong)&hyp_rel);
    uVar9 = uVar9 + 1;
    std::__cxx11::string::operator=((string *)&hyp_rel,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    poVar8 = std::operator<<(poVar8,'\t');
    poVar8 = std::operator<<(poVar8,(string *)&wit);
    poVar8 = std::operator<<(poVar8,'\t');
    poVar8 = std::operator<<(poVar8,"_");
    poVar8 = std::operator<<(poVar8,'\t');
    poVar8 = std::operator<<(poVar8,"_");
    poVar8 = std::operator<<(poVar8,'\t');
    poVar8 = std::operator<<(poVar8,(string *)&cVar5._M_node[1]._M_parent);
    poVar8 = std::operator<<(poVar8,'\t');
    poVar8 = std::operator<<(poVar8,"_");
    poVar8 = std::operator<<(poVar8,'\t');
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
    poVar8 = std::operator<<(poVar8,'\t');
    poVar8 = std::operator<<(poVar8,(string *)&hyp_rel);
    poVar8 = std::operator<<(poVar8,'\t');
    poVar8 = std::operator<<(poVar8,"_");
    poVar8 = std::operator<<(poVar8,'\t');
    poVar8 = std::operator<<(poVar8,"_");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&hyp_rel);
    std::__cxx11::string::~string((string *)&wit);
  } while( true );
}

Assistant:

void output_conll(const vector<unsigned>& sentence, const vector<unsigned>& pos,
                  const vector<string>& sentenceUnkStrings, 
                  const map<unsigned, string>& intToWords, 
                  const map<unsigned, string>& intToPos, 
                  const map<int,int>& hyp, const map<int,string>& rel_hyp) {
  for (unsigned i = 0; i < (sentence.size()-1); ++i) {
    auto index = i + 1;
    assert(i < sentenceUnkStrings.size() && 
           ((sentence[i] == corpus.get_or_add_word(cpyp::Corpus::UNK) &&
             sentenceUnkStrings[i].size() > 0) ||
            (sentence[i] != corpus.get_or_add_word(cpyp::Corpus::UNK) &&
             sentenceUnkStrings[i].size() == 0 &&
             intToWords.find(sentence[i]) != intToWords.end())));
    string wit = (sentenceUnkStrings[i].size() > 0)? 
      sentenceUnkStrings[i] : intToWords.find(sentence[i])->second;
    auto pit = intToPos.find(pos[i]);
    assert(hyp.find(i) != hyp.end());
    auto hyp_head = hyp.find(i)->second + 1;
    if (hyp_head == (int)sentence.size()) hyp_head = 0;
    auto hyp_rel_it = rel_hyp.find(i);
    assert(hyp_rel_it != rel_hyp.end());
    auto hyp_rel = hyp_rel_it->second;
    size_t first_char_in_rel = hyp_rel.find('(') + 1;
    size_t last_char_in_rel = hyp_rel.rfind(')') - 1;
    hyp_rel = hyp_rel.substr(first_char_in_rel, last_char_in_rel - first_char_in_rel + 1);
    cout << index << '\t'       // 1. ID 
         << wit << '\t'         // 2. FORM
         << "_" << '\t'         // 3. LEMMA 
         << "_" << '\t'         // 4. CPOSTAG 
         << pit->second << '\t' // 5. POSTAG
         << "_" << '\t'         // 6. FEATS
         << hyp_head << '\t'    // 7. HEAD
         << hyp_rel << '\t'     // 8. DEPREL
         << "_" << '\t'         // 9. PHEAD
         << "_" << endl;        // 10. PDEPREL
  }
  cout << endl;
}